

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flecs.hpp
# Opt level: O3

entity flecs::pod_component<Position>(world *world,char *name,bool allow_tag)

{
  world_t *world_00;
  ecs_world_t *world_01;
  int iVar1;
  entity_t entity;
  ecs_type_t peVar2;
  char *__s1;
  size_t size;
  size_t alignment;
  ecs_entity_t eVar3;
  void *pvVar4;
  entity eVar5;
  
  if (name == (char *)0x0) {
    _::name_helper<Position>::name()::typeName._0_8_ = 0x6e6f697469736f50;
    _::name_util::trim_name(_::name_helper<Position>::name()::typeName);
    name = _::name_helper<Position>::name()::typeName;
  }
  world_00 = world->m_world;
  if (_::component_info<Position>::s_id == 0) {
    eVar3 = ecs_lookup_path_w_sep(world_00,0,name,".",(char *)0x0);
    if (eVar3 != 0) {
      pvVar4 = ecs_get_mut_w_entity(world->m_world,eVar3,6,(_Bool *)0x0);
      _ecs_assert(pvVar4 != (void *)0x0,0xc,(char *)0x0,"name_comp != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/include/flecs/flecs.hpp"
                  ,0xec3);
      if (pvVar4 == (void *)0x0) {
        __assert_fail("name_comp != __null",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/include/flecs/flecs.hpp"
                      ,0xec3,
                      "flecs::entity flecs::pod_component(const flecs::world &, const char *, bool) [T = Position]"
                     );
      }
      _ecs_assert(*(long *)((long)pvVar4 + 8) != 0,0xc,(char *)0x0,"name_comp->symbol != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/include/flecs/flecs.hpp"
                  ,0xec4);
      if (*(long *)((long)pvVar4 + 8) == 0) {
        __assert_fail("name_comp->symbol != __null",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/include/flecs/flecs.hpp"
                      ,0xec4,
                      "flecs::entity flecs::pod_component(const flecs::world &, const char *, bool) [T = Position]"
                     );
      }
      _::name_helper<Position>::name()::typeName._0_8_ = 0x6e6f697469736f50;
      _::name_util::trim_name(_::name_helper<Position>::name()::typeName);
      iVar1 = strcmp(*(char **)((long)pvVar4 + 8),_::name_helper<Position>::name()::typeName);
      _ecs_assert(iVar1 == 0,0x2f,name,"!strcmp(name_comp->symbol, symbol)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/include/flecs/flecs.hpp"
                  ,0xec9);
      iVar1 = strcmp(*(char **)((long)pvVar4 + 8),_::name_helper<Position>::name()::typeName);
      if (iVar1 != 0) {
        __assert_fail("!strcmp(name_comp->symbol, symbol)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/include/flecs/flecs.hpp"
                      ,0xec9,
                      "flecs::entity flecs::pod_component(const flecs::world &, const char *, bool) [T = Position]"
                     );
      }
    }
    entity = _::component_info<Position>::id_no_lifecycle(world_00,name,allow_tag);
  }
  else {
    entity = _::component_info<Position>::id_no_lifecycle(world_00,name,allow_tag);
    peVar2 = ecs_get_type(world_00,entity);
    if ((0x1f < entity) && (peVar2 != (ecs_type_t)0x0)) {
      __s1 = ecs_get_path_w_sep(world_00,0,entity,0,"::",(char *)0x0);
      iVar1 = strcmp(__s1,name);
      _ecs_assert(iVar1 == 0,0x2a,name,"!strcmp(path, name)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/include/flecs/flecs.hpp"
                  ,0xe9b);
      iVar1 = strcmp(__s1,name);
      if (iVar1 != 0) {
        __assert_fail("!strcmp(path, name)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/include/flecs/flecs.hpp"
                      ,0xe9b,
                      "flecs::entity flecs::pod_component(const flecs::world &, const char *, bool) [T = Position]"
                     );
      }
      (*ecs_os_api.free_)(__s1);
    }
    ecs_add_path_w_sep(world_00,entity,0,name,"::","::");
    world_01 = world->m_world;
    size = _::component_info<Position>::size();
    alignment = _::component_info<Position>::alignment();
    eVar3 = ecs_new_component(world_01,entity,(char *)0x0,size,alignment);
    _ecs_assert(eVar3 == entity,0xc,(char *)0x0,"entity == id",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/include/flecs/flecs.hpp"
                ,0xeb3);
    if (eVar3 != entity) {
      __assert_fail("entity == id",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/include/flecs/flecs.hpp"
                    ,0xeb3,
                    "flecs::entity flecs::pod_component(const flecs::world &, const char *, bool) [T = Position]"
                   );
    }
  }
  _::component_info<Position>::init((EVP_PKEY_CTX *)world_00);
  _::component_info<const_Position>::init((EVP_PKEY_CTX *)world_00);
  _::component_info<Position_*>::init((EVP_PKEY_CTX *)world_00);
  _::component_info<Position_&>::init((EVP_PKEY_CTX *)world_00);
  eVar5.m_id = entity;
  eVar5.m_world = world->m_world;
  return eVar5;
}

Assistant:

flecs::entity pod_component(const flecs::world& world, const char *name = nullptr, bool allow_tag = true) {
    if (!name) {
        name = _::name_helper<T>::name();
    }

    world_t *world_ptr = world.c_ptr();
    entity_t id = 0;

    if (_::component_info<T>::registered()) {
        /* Obtain component id. Because the component is already registered,
         * this operation does nothing besides returning the existing id */
        id = _::component_info<T>::id_no_lifecycle(world_ptr, name, allow_tag);

        /* If entity is not empty check if the name matches */
        if (ecs_get_type(world_ptr, id) != nullptr) {
            if (id >= EcsFirstUserComponentId) {
                char *path = ecs_get_path_w_sep(
                    world_ptr, 0, id, 0, "::", nullptr);
                ecs_assert(!strcmp(path, name), 
                    ECS_INCONSISTENT_COMPONENT_NAME, name);
                ecs_os_free(path);
            }
        }

        /* Register name with entity, so that when the entity is created the
         * correct id will be resolved from the name. */
        ecs_add_path_w_sep(world_ptr, id, 0, name, "::", "::");

        /* If a component was already registered with this id but with a 
         * different size, the ecs_new_component function will fail. */

        /* We need to explicitly call ecs_new_component here again. Even though
         * the component was already registered, it may have been registered
         * with a different world. This ensures that the component is registered
         * with the same id for the current world. 
         * If the component was registered already, nothing will change. */
        ecs_entity_t entity = ecs_new_component(
            world.c_ptr(), id, nullptr, 
            _::component_info<T>::size(), 
            _::component_info<T>::alignment());
        
        (void)entity;
        
        ecs_assert(entity == id, ECS_INTERNAL_ERROR, NULL);

        /* This functionality could have been put in id_no_lifecycle, but since
         * this code happens when a component is registered, and the entire API
         * calls id_no_lifecycle, this would add a lot of overhead to each call.
         * This is why when using multiple worlds, components should be 
         * registered explicitly. */
    } else {
        /* If the component is not yet registered, ensure no other component
         * or entity has been registered with this name */
        ecs_entity_t entity = ecs_lookup_fullpath(world_ptr, name);

        /* If entity exists, compare symbol name to ensure that the component
         * we are trying to register under this name is the same */
        if (entity) {
            const EcsName *name_comp = ecs_get_mut(world.c_ptr(), entity, EcsName, NULL);
            ecs_assert(name_comp != NULL, ECS_INTERNAL_ERROR, NULL);
            ecs_assert(name_comp->symbol != NULL, ECS_INTERNAL_ERROR, NULL);

            const char *symbol = _::name_helper<T>::name();

            ecs_assert(!strcmp(name_comp->symbol, symbol), 
                ECS_COMPONENT_NAME_IN_USE, name);

            (void)name_comp;
            (void)symbol;
        }

        /* Register id as usual */
        id = _::component_info<T>::id_no_lifecycle(world_ptr, name, allow_tag);
    }

    _::component_info<T>::init(world_ptr, id, allow_tag);
    _::component_info<const T>::init(world_ptr, id, allow_tag);
    _::component_info<T*>::init(world_ptr, id, allow_tag);
    _::component_info<T&>::init(world_ptr, id, allow_tag);
    
    return world.entity(id);
}